

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

int __thiscall asl::Var::length(Var *this)

{
  int iVar1;
  Array<asl::Var> *this_00;
  Map<asl::String,_asl::Var> *this_01;
  Array<char> *this_02;
  size_t sVar2;
  Var *this_local;
  
  switch(this->_type) {
  case SSTRING:
    sVar2 = strlen((this->field_1)._ss);
    this_local._4_4_ = (int)sVar2;
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case STRING:
    this_02 = StaticSpace<asl::Array<char>_>::operator->(&(this->field_1)._s);
    iVar1 = Array<char>::length(this_02);
    this_local._4_4_ = iVar1 + -1;
    break;
  case ARRAY:
    this_00 = StaticSpace<asl::Array<asl::Var>_>::operator->(&(this->field_1)._a);
    this_local._4_4_ = Array<asl::Var>::length(this_00);
    break;
  case DIC:
    this_01 = &StaticSpace<asl::Dic<asl::Var>_>::operator->(&(this->field_1)._o)->
               super_Map<asl::String,_asl::Var>;
    this_local._4_4_ = Map<asl::String,_asl::Var>::length(this_01);
  }
  return this_local._4_4_;
}

Assistant:

int Var::length() const
{
	switch(_type) {
	case ARRAY:
		return _a->length(); break;
	case OBJ:
		return _o->length(); break;
	case STRING:
		return _s->length()-1; break;
	case SSTRING:
		return (int)strlen(_ss); break;
	default:
		break;
	}
	return 0;
}